

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.h
# Opt level: O0

GMM_TILE_TYPE __thiscall GmmLib::GmmResourceInfoCommon::GetTileType(GmmResourceInfoCommon *this)

{
  GmmResourceInfoCommon *this_local;
  
  if (((ulong)(this->Surf).Flags.Info >> 0x22 & 1) == 0) {
    if (((ulong)(this->Surf).Flags.Info >> 0x23 & 1) == 0) {
      if (((ulong)(this->Surf).Flags.Info >> 0x24 & 1) == 0) {
        if (((ulong)(this->Surf).Flags.Info >> 0x2b & 1) == 0) {
          if (((ulong)(this->Surf).Flags.Info >> 0x2c & 1) == 0) {
            this_local._4_4_ = GMM_NOT_TILED;
          }
          else {
            this_local._4_4_ = GMM_TILED_64;
          }
        }
        else {
          this_local._4_4_ = GMM_TILED_4;
        }
      }
      else {
        this_local._4_4_ = GMM_TILED_Y;
      }
    }
    else {
      this_local._4_4_ = GMM_TILED_X;
    }
  }
  else {
    this_local._4_4_ = GMM_TILED_W;
  }
  return this_local._4_4_;
}

Assistant:

GMM_INLINE_VIRTUAL GMM_INLINE_EXPORTED GMM_TILE_TYPE GMM_STDCALL GetTileType()
            {
                if (Surf.Flags.Info.TiledW)
                {
                    return GMM_TILED_W;
                }
                else if (Surf.Flags.Info.TiledX)
                {
                    return GMM_TILED_X;
                }
                // Surf.Flags.Info.TiledYs/Yf tiling are only in
                // conjunction with Surf.Flags.Info.TiledY/Linear depending on resource type (1D).
                else if (Surf.Flags.Info.TiledY)
                {
                    return GMM_TILED_Y;
                }
                else if (Surf.Flags.Info.Tile4)
                {
                    return GMM_TILED_4;
                }
                else if (Surf.Flags.Info.Tile64)
                {
                    return GMM_TILED_64;
                }

                return GMM_NOT_TILED;
            }